

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>::iterator,_bool>
* __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
::
emplace_decomposable<std::__cxx11::string,std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string_const&>,std::tuple<unsigned_long&&>>
          (pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
          *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
          size_t hashval,piecewise_construct_t *args,
          tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *args_1,tuple<unsigned_long_&&> *args_2)

{
  long lVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  unsigned_long *puVar4;
  pointer pcVar5;
  size_t i;
  pair<unsigned_long,_bool> pVar6;
  
  pVar6 = find_or_prepare_insert<std::__cxx11::string>(this,key,hashval);
  i = pVar6.first;
  if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    lVar2 = *(long *)(this + 8);
    pbVar3 = (args_1->
             super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
             ).
             super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
             ._M_head_impl;
    puVar4 = (args_2->super__Tuple_impl<0UL,_unsigned_long_&&>).
             super__Head_base<0UL,_unsigned_long_&&,_false>._M_head_impl;
    lVar1 = lVar2 + 0x10 + i * 0x28;
    *(long *)(lVar1 + -0x10) = lVar1;
    pcVar5 = (pbVar3->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(lVar2 + i * 0x28),pcVar5,pcVar5 + pbVar3->_M_string_length);
    *(unsigned_long *)(lVar1 + 0x10) = *puVar4;
    raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::set_ctrl((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                *)this,i,(byte)hashval & 0x7f);
  }
  lVar1 = *(long *)(this + 8);
  (__return_storage_ptr__->first).ctrl_ = (ctrl_t *)(*(long *)this + i);
  (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(i * 0x28 + lVar1);
  __return_storage_ptr__->second = pVar6.second;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> emplace_decomposable(const K& key, size_t hashval,
			        Args&&... args)
			{
				auto res = find_or_prepare_insert(key, hashval);
				if (res.second) {
					emplace_at(res.first, std::forward<Args>(args)...);
					this->set_ctrl(res.first, H2(hashval));
				}
				return {iterator_at(res.first), res.second};
			}